

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Node::Node(Node *this,string *path,uint64_t slash_bits)

{
  uint64_t slash_bits_local;
  string *path_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  this->slash_bits_ = slash_bits;
  this->mtime_ = -1;
  this->dirty_ = false;
  this->dyndep_pending_ = false;
  this->in_edge_ = (Edge *)0x0;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::vector(&this->out_edges_);
  this->id_ = -1;
  return;
}

Assistant:

Node(const std::string& path, uint64_t slash_bits)
      : path_(path),
        slash_bits_(slash_bits),
        mtime_(-1),
        dirty_(false),
        dyndep_pending_(false),
        in_edge_(NULL),
        id_(-1) {}